

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.h
# Opt level: O2

string * __thiscall
ICM::Instruction::Insts::JumpCompare::getToString_abi_cxx11_
          (string *__return_storage_ptr__,JumpCompare *this)

{
  string sStack_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  Compare::getToString_abi_cxx11_(&local_38,&this->super_Compare);
  std::operator+(&local_78,&local_38,", {");
  std::__cxx11::to_string(&sStack_98,this->Index);
  std::operator+(&local_58,&local_78,&sStack_98);
  std::operator+(__return_storage_ptr__,&local_58,"}");
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&sStack_98);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

string getToString() const { return  Compare::getToString() + ", {" + std::to_string(Index) + "}"; }